

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  byte bVar1;
  uint uVar2;
  StkId pTVar3;
  char *pcVar4;
  GCObject *pGVar5;
  long *plVar6;
  char *pcVar7;
  undefined8 *puVar8;
  int *piVar9;
  lua_Number *plVar10;
  int iVar11;
  lua_Number lVar12;
  char buff [3];
  char local_58;
  byte local_57;
  undefined1 local_56;
  
  pushstr(L,"");
  iVar11 = 1;
  do {
    pcVar4 = strchr(fmt,0x25);
    if (pcVar4 != (char *)0x0) {
      pTVar3 = L->top;
      pGVar5 = (GCObject *)luaS_newlstr(L,fmt,(long)pcVar4 - (long)fmt);
      (pTVar3->value).gc = pGVar5;
      pTVar3->tt = 4;
      if ((long)L->stack_last - (long)L->top < 0x11) {
        luaD_growstack(L,1);
      }
      pTVar3 = L->top;
      L->top = pTVar3 + 1;
      bVar1 = pcVar4[1];
      if (bVar1 < 0x66) {
        if (bVar1 == 0x25) {
          pcVar7 = "%";
        }
        else if (bVar1 == 99) {
          uVar2 = argp->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            pcVar7 = (char *)((ulong)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            pcVar7 = (char *)argp->overflow_arg_area;
            argp->overflow_arg_area = pcVar7 + 8;
          }
          local_58 = *pcVar7;
          local_57 = 0;
          pcVar7 = &local_58;
        }
        else {
          if (bVar1 == 100) {
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              piVar9 = (int *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              piVar9 = (int *)argp->overflow_arg_area;
              argp->overflow_arg_area = piVar9 + 2;
            }
            lVar12 = (lua_Number)*piVar9;
            goto LAB_0010495d;
          }
LAB_001048e8:
          local_58 = '%';
          local_56 = 0;
          pcVar7 = &local_58;
          local_57 = bVar1;
        }
LAB_001049f4:
        pushstr(L,pcVar7);
      }
      else {
        if (bVar1 != 0x66) {
          if (bVar1 == 0x70) {
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              puVar8 = (undefined8 *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              puVar8 = (undefined8 *)argp->overflow_arg_area;
              argp->overflow_arg_area = puVar8 + 1;
            }
            sprintf(&local_58,"%p",*puVar8);
            pcVar7 = &local_58;
          }
          else {
            if (bVar1 != 0x73) goto LAB_001048e8;
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              plVar6 = (long *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              plVar6 = (long *)argp->overflow_arg_area;
              argp->overflow_arg_area = plVar6 + 1;
            }
            pcVar7 = (char *)*plVar6;
            if ((char *)*plVar6 == (char *)0x0) {
              pcVar7 = "(null)";
            }
          }
          goto LAB_001049f4;
        }
        uVar2 = argp->fp_offset;
        if ((ulong)uVar2 < 0xa1) {
          plVar10 = (lua_Number *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->fp_offset = uVar2 + 0x10;
        }
        else {
          plVar10 = (lua_Number *)argp->overflow_arg_area;
          argp->overflow_arg_area = plVar10 + 1;
        }
        lVar12 = *plVar10;
LAB_0010495d:
        pTVar3[1].value.n = lVar12;
        pTVar3[1].tt = 3;
        if ((long)L->stack_last - (long)L->top < 0x11) {
          luaD_growstack(L,1);
        }
        L->top = L->top + 1;
      }
      iVar11 = iVar11 + 2;
      fmt = pcVar4 + 2;
    }
    if (pcVar4 == (char *)0x0) {
      pushstr(L,fmt);
      luaV_concat(L,iVar11 + 1,(int)((ulong)((long)L->top - (long)L->base) >> 4) + -1);
      pTVar3 = L->top;
      L->top = pTVar3 + -(long)iVar11;
      return (char *)&((pTVar3[-1 - (long)iVar11].value.gc)->h).array;
    }
  } while( true );
}

Assistant:

static const char*luaO_pushvfstring(lua_State*L,const char*fmt,va_list argp){
int n=1;
pushstr(L,"");
for(;;){
const char*e=strchr(fmt,'%');
if(e==NULL)break;
setsvalue(L,L->top,luaS_newlstr(L,fmt,e-fmt));
incr_top(L);
switch(*(e+1)){
case's':{
const char*s=va_arg(argp,char*);
if(s==NULL)s="(null)";
pushstr(L,s);
break;
}
case'c':{
char buff[2];
buff[0]=cast(char,va_arg(argp,int));
buff[1]='\0';
pushstr(L,buff);
break;
}
case'd':{
setnvalue(L->top,cast_num(va_arg(argp,int)));
incr_top(L);
break;
}
case'f':{
setnvalue(L->top,cast_num(va_arg(argp,l_uacNumber)));
incr_top(L);
break;
}
case'p':{
char buff[4*sizeof(void*)+8];
sprintf(buff,"%p",va_arg(argp,void*));
pushstr(L,buff);
break;
}
case'%':{
pushstr(L,"%");
break;
}
default:{
char buff[3];
buff[0]='%';
buff[1]=*(e+1);
buff[2]='\0';
pushstr(L,buff);
break;
}
}
n+=2;
fmt=e+2;
}
pushstr(L,fmt);
luaV_concat(L,n+1,cast_int(L->top-L->base)-1);
L->top-=n;
return svalue(L->top-1);
}